

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O0

DispatchCallResult __thiscall
capnproto_test::capnp::test::TestInterface::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  CallContext<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  CVar1;
  CallContext<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  CVar2;
  CallContext<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  CVar3;
  CallContext<capnproto_test::capnp::test::TestInterface::GetTestPipelineParams,_capnproto_test::capnp::test::TestInterface::GetTestPipelineResults>
  CVar4;
  CallContext<capnproto_test::capnp::test::TestInterface::GetTestTailCalleeParams,_capnproto_test::capnp::test::TestInterface::GetTestTailCalleeResults>
  CVar5;
  CallContext<capnproto_test::capnp::test::TestInterface::GetTestTailCallerParams,_capnproto_test::capnp::test::TestInterface::GetTestTailCallerResults>
  CVar6;
  CallContext<capnproto_test::capnp::test::TestInterface::GetTestMoreStuffParams,_capnproto_test::capnp::test::TestInterface::GetTestMoreStuffResults>
  CVar7;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined6 in_register_00000032;
  long *plVar9;
  DispatchCallResult DVar10;
  uint16_t methodId_local;
  Server *this_local;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> context_local;
  undefined8 uVar8;
  
  plVar9 = (long *)CONCAT62(in_register_00000032,methodId);
  switch((ulong)context.hook & 0xffff) {
  case 0:
    CVar1 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestInterface::FooParams,capnproto_test::capnp::test::TestInterface::FooResults>
                      ((Server *)((long)plVar9 + *(long *)(*plVar9 + -0x18)),in_RCX);
    (**(code **)(*plVar9 + 8))(this,plVar9,CVar1.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar8 = extraout_RDX;
    break;
  case 1:
    CVar2 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestInterface::BarParams,capnproto_test::capnp::test::TestInterface::BarResults>
                      ((Server *)((long)plVar9 + *(long *)(*plVar9 + -0x18)),in_RCX);
    (**(code **)(*plVar9 + 0x10))(this,plVar9,CVar2.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar8 = extraout_RDX_00;
    break;
  case 2:
    CVar3 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestInterface::BazParams,capnproto_test::capnp::test::TestInterface::BazResults>
                      ((Server *)((long)plVar9 + *(long *)(*plVar9 + -0x18)),in_RCX);
    (**(code **)(*plVar9 + 0x18))(this,plVar9,CVar3.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar8 = extraout_RDX_01;
    break;
  case 3:
    CVar4 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestInterface::GetTestPipelineParams,capnproto_test::capnp::test::TestInterface::GetTestPipelineResults>
                      ((Server *)((long)plVar9 + *(long *)(*plVar9 + -0x18)),in_RCX);
    (**(code **)(*plVar9 + 0x20))(this,plVar9,CVar4.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar8 = extraout_RDX_02;
    break;
  case 4:
    CVar5 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestInterface::GetTestTailCalleeParams,capnproto_test::capnp::test::TestInterface::GetTestTailCalleeResults>
                      ((Server *)((long)plVar9 + *(long *)(*plVar9 + -0x18)),in_RCX);
    (**(code **)(*plVar9 + 0x28))(this,plVar9,CVar5.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar8 = extraout_RDX_03;
    break;
  case 5:
    CVar6 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestInterface::GetTestTailCallerParams,capnproto_test::capnp::test::TestInterface::GetTestTailCallerResults>
                      ((Server *)((long)plVar9 + *(long *)(*plVar9 + -0x18)),in_RCX);
    (**(code **)(*plVar9 + 0x30))(this,plVar9,CVar6.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar8 = extraout_RDX_04;
    break;
  case 6:
    CVar7 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestInterface::GetTestMoreStuffParams,capnproto_test::capnp::test::TestInterface::GetTestMoreStuffResults>
                      ((Server *)((long)plVar9 + *(long *)(*plVar9 + -0x18)),in_RCX);
    (**(code **)(*plVar9 + 0x38))(this,plVar9,CVar7.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar8 = extraout_RDX_05;
    break;
  default:
    DVar10 = ::capnp::Capability::Server::internalUnimplemented
                       ((Server *)this,(char *)((long)plVar9 + *(long *)(*plVar9 + -0x18)),0x491b68,
                        0x92b2);
    uVar8 = DVar10._8_8_;
  }
  DVar10.isStreaming = (bool)(char)uVar8;
  DVar10.allowCancellation = (bool)(char)((ulong)uVar8 >> 8);
  DVar10._10_6_ = (int6)((ulong)uVar8 >> 0x10);
  DVar10.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar10;
}

Assistant:

::capnp::Capability::Server::DispatchCallResult TestInterface::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return {
        foo(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestInterface::FooParams,  ::capnproto_test::capnp::test::TestInterface::FooResults>(context)),
        false,
        false
      };
    case 1:
      return {
        bar(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestInterface::BarParams,  ::capnproto_test::capnp::test::TestInterface::BarResults>(context)),
        false,
        false
      };
    case 2:
      return {
        baz(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestInterface::BazParams,  ::capnproto_test::capnp::test::TestInterface::BazResults>(context)),
        false,
        false
      };
    case 3:
      return {
        getTestPipeline(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestInterface::GetTestPipelineParams,  ::capnproto_test::capnp::test::TestInterface::GetTestPipelineResults>(context)),
        false,
        false
      };
    case 4:
      return {
        getTestTailCallee(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestInterface::GetTestTailCalleeParams,  ::capnproto_test::capnp::test::TestInterface::GetTestTailCalleeResults>(context)),
        false,
        false
      };
    case 5:
      return {
        getTestTailCaller(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestInterface::GetTestTailCallerParams,  ::capnproto_test::capnp::test::TestInterface::GetTestTailCallerResults>(context)),
        false,
        false
      };
    case 6:
      return {
        getTestMoreStuff(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestInterface::GetTestMoreStuffParams,  ::capnproto_test::capnp::test::TestInterface::GetTestMoreStuffResults>(context)),
        false,
        false
      };
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestInterface",
          0x88eb12a0e0af92b2ull, methodId);
  }
}